

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  int iVar1;
  const_iterator __position;
  cmCTest *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  __single_object _Var4;
  __single_object _Var5;
  __type _Var6;
  mapped_type *ppcVar7;
  size_t sVar8;
  ostream *poVar9;
  mapped_type_conflict1 *pmVar10;
  mapped_type *__x;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
  *this_01;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  string *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner;
  char *pcVar15;
  cmCTestTestResourceRequirement *requirement;
  pointer __lhs;
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  *group;
  _Base_ptr p_Var16;
  pointer pvVar17;
  bool bVar18;
  int test_local;
  __single_object testRun;
  allocator<char> local_271;
  PropertiesMap *local_270;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_268;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_260;
  string local_258;
  cmCTestMultiProcessHandler *local_238;
  cmCTestResourceAllocator *local_230;
  _Base_ptr local_228;
  _Base_ptr local_220;
  pointer local_218;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_210;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  cmWorkingDirectory workdir;
  
  test_local = test;
  if (this->HaveAffinity != 0) {
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    if ((*ppcVar7)->WantAffinity == true) {
      sVar8 = GetProcessorsUsed(this,test_local);
      if ((this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar8) {
        return false;
      }
      workdir.OldDir._M_dataplus._M_p = (pointer)0x0;
      workdir.OldDir._M_string_length = 0;
      workdir.OldDir.field_2._M_allocated_capacity = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&workdir,sVar8);
      while (bVar18 = sVar8 != 0, sVar8 = sVar8 - 1, bVar18) {
        __position._M_node =
             (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&workdir,
                   (value_type_conflict1 *)(__position._M_node + 1));
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&this->ProcessorsAvailable,__position);
      }
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&test_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (&(*ppcVar7)->Affinity,&workdir);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&workdir);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&workdir);
  poVar9 = std::operator<<((ostream *)&workdir,"test ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,test_local);
  std::operator<<(poVar9,"\n");
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0xa8,local_258._M_dataplus._M_p,this->Quiet);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&workdir);
  pmVar10 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
            operator[](&this->TestRunningMap,&test_local);
  *pmVar10 = true;
  EraseTest(this,test_local);
  sVar8 = GetProcessorsUsed(this,test_local);
  this->RunningCount = this->RunningCount + sVar8;
  std::make_unique<cmCTestRunTest,cmCTestMultiProcessHandler&>
            ((cmCTestMultiProcessHandler *)&testRun);
  _Var4 = testRun;
  if (this->RepeatMode != Never) {
    *(Repeat *)
     ((long)testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>
            ._M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
            super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 0x270) = this->RepeatMode;
    iVar1 = this->RepeatCount;
    *(int *)((long)testRun._M_t.
                   super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                   super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                   super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 0x274) = iVar1;
    *(int *)((long)testRun._M_t.
                   super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                   super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                   super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 0x278) = iVar1;
  }
  *(int *)((long)testRun._M_t.
                 super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                 super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                 super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 0x1c0) = test_local;
  local_270 = &this->Properties;
  ppcVar7 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_270->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&test_local);
  _Var5 = testRun;
  *(mapped_type *)
   _Var4._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
   super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
   super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl = *ppcVar7;
  if (this->TestHandler->UseResourceSpec == true) {
    *(undefined1 *)
     ((long)testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>
            ._M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
            super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 0x250) = 1;
    __x = std::map<$a129e267$>::operator[](&this->AllocatedResources,&test_local);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
    ::operator=((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                 *)((long)_Var5._M_t.
                          super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>
                          .super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 600),__x);
  }
  pbVar2 = (this->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (key = (this->Failed->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; key != pbVar2; key = key + 1) {
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_270->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    bVar18 = ::cm::
             contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       (&(*ppcVar7)->RequireSuccessDepends,key);
    if (bVar18) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)((long)testRun._M_t.
                           super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>
                           .super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl + 0x1c8),key
                );
    }
  }
  LockResources(this,test_local);
  pmVar11 = std::
            map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
            ::operator[](&this->ResourceAllocationErrors,&test_local);
  if ((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_270->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    cmWorkingDirectory::cmWorkingDirectory(&workdir,&(*ppcVar7)->Directory);
    _Var4 = testRun;
    if (workdir.ResultCode == 0) {
      testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
      super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
      super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCTestRunTest,_std::default_delete<cmCTestRunTest>,_true,_true>)
           (__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>)0x0;
      runner = &local_210;
      local_210._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
      _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
      super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
           _Var4._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
           _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
           super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
      bVar18 = cmCTestRunTest::StartTest(runner,this->Completed,this->Total);
    }
    else {
      local_260._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
      _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
      super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
           testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
           _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
           super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
      testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
      super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
      super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCTestRunTest,_std::default_delete<cmCTestRunTest>,_true,_true>)
           (__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>)0x0;
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_270->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&test_local);
      std::operator+(&local_1e8,"Failed to change working directory to ",&(*ppcVar7)->Directory);
      std::operator+(&local_208,&local_1e8," : ");
      pcVar15 = strerror(workdir.ResultCode);
      std::operator+(&local_258,&local_208,pcVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Failed to change working directory",&local_271);
      runner = &local_260;
      cmCTestRunTest::StartFailure(runner,&local_258,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      bVar18 = false;
    }
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(runner);
    cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&workdir);
    poVar9 = std::operator<<((ostream *)&workdir,"Insufficient resources for test ");
    ppcVar7 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_270->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&test_local);
    poVar9 = std::operator<<(poVar9,(string *)*ppcVar7);
    std::operator<<(poVar9,":\n\n");
    pmVar11 = std::
              map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
              ::operator[](&this->ResourceAllocationErrors,&test_local);
    p_Var16 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_230 = &this->ResourceAllocator;
    local_238 = this;
    local_228 = p_Var16;
    for (p_Var12 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var12 != p_Var16; p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      p_Var14 = p_Var12 + 1;
      if (p_Var12[2]._M_color == _S_black) {
        poVar9 = std::operator<<((ostream *)&workdir,"  Test requested resources of type \'");
        poVar9 = std::operator<<(poVar9,(string *)p_Var14);
        std::operator<<(poVar9,"\' in the following amounts:\n");
        ppcVar7 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&local_270->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&test_local);
        local_218 = ((*ppcVar7)->ResourceGroups).
                    super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        local_220 = p_Var12;
        for (pvVar17 = ((*ppcVar7)->ResourceGroups).
                       super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pvVar17 != local_218;
            pvVar17 = pvVar17 + 1) {
          pcVar3 = (pvVar17->
                   super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (__lhs = (pvVar17->
                       super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                       )._M_impl.super__Vector_impl_data._M_start; __lhs != pcVar3;
              __lhs = __lhs + 1) {
            _Var6 = std::operator==(&__lhs->ResourceType,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var14);
            if (_Var6) {
              poVar9 = std::operator<<((ostream *)&workdir,"    ");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,__lhs->SlotsNeeded);
              pcVar15 = " slots\n";
              if (__lhs->SlotsNeeded == 1) {
                pcVar15 = " slot\n";
              }
              std::operator<<(poVar9,pcVar15);
            }
          }
        }
        std::operator<<((ostream *)&workdir,"  but only the following units were available:\n");
        p_Var12 = local_220;
        p_Var16 = local_228;
        this_01 = cmCTestResourceAllocator::GetResources_abi_cxx11_(local_230);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
                  ::at(this_01,(key_type *)p_Var14);
        for (p_Var14 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var14 != &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
          poVar9 = std::operator<<((ostream *)&workdir,"    \'");
          poVar9 = std::operator<<(poVar9,(string *)(p_Var14 + 1));
          poVar9 = std::operator<<(poVar9,"\': ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          pcVar15 = " slots\n";
          if (p_Var14[2]._M_color == _S_black) {
            pcVar15 = " slot\n";
          }
          std::operator<<(poVar9,pcVar15);
        }
      }
      else if (p_Var12[2]._M_color == _S_red) {
        poVar9 = std::operator<<((ostream *)&workdir,"  Test requested resources of type \'");
        poVar9 = std::operator<<(poVar9,(string *)p_Var14);
        std::operator<<(poVar9,"\' which does not exist\n");
      }
      std::operator<<((ostream *)&workdir,"\n");
    }
    poVar9 = std::operator<<((ostream *)&workdir,"Resource spec file:\n\n  ");
    std::operator<<(poVar9,(string *)&local_238->TestHandler->ResourceSpecFile);
    local_268._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
    super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
    super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
         testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
         _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
         super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
    testRun._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
    super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
    super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCTestRunTest,_std::default_delete<cmCTestRunTest>,_true,_true>)
         (__uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>)0x0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Insufficient resources",(allocator<char> *)&local_1e8);
    cmCTestRunTest::StartFailure(&local_268,&local_258,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_258);
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&workdir);
    bVar18 = false;
  }
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&testRun);
  return bVar18;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += this->GetProcessorsUsed(test);

  auto testRun = cm::make_unique<cmCTestRunTest>(*this);

  if (this->RepeatMode != cmCTest::Repeat::Never) {
    testRun->SetRepeatMode(this->RepeatMode);
    testRun->SetNumberOfRuns(this->RepeatCount);
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);
  if (this->TestHandler->UseResourceSpec) {
    testRun->SetUseAllocatedResources(true);
    testRun->SetAllocatedResources(this->AllocatedResources[test]);
  }

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (cm::contains(this->Properties[test]->RequireSuccessDepends, f)) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  if (!this->ResourceAllocationErrors[test].empty()) {
    std::ostringstream e;
    e << "Insufficient resources for test " << this->Properties[test]->Name
      << ":\n\n";
    for (auto const& it : this->ResourceAllocationErrors[test]) {
      switch (it.second) {
        case ResourceAllocationError::NoResourceType:
          e << "  Test requested resources of type '" << it.first
            << "' which does not exist\n";
          break;

        case ResourceAllocationError::InsufficientResources:
          e << "  Test requested resources of type '" << it.first
            << "' in the following amounts:\n";
          for (auto const& group : this->Properties[test]->ResourceGroups) {
            for (auto const& requirement : group) {
              if (requirement.ResourceType == it.first) {
                e << "    " << requirement.SlotsNeeded
                  << (requirement.SlotsNeeded == 1 ? " slot\n" : " slots\n");
              }
            }
          }
          e << "  but only the following units were available:\n";
          for (auto const& res :
               this->ResourceAllocator.GetResources().at(it.first)) {
            e << "    '" << res.first << "': " << res.second.Total
              << (res.second.Total == 1 ? " slot\n" : " slots\n");
          }
          break;
      }
      e << "\n";
    }
    e << "Resource spec file:\n\n  " << this->TestHandler->ResourceSpecFile;
    cmCTestRunTest::StartFailure(std::move(testRun), e.str(),
                                 "Insufficient resources");
    return false;
  }

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    cmCTestRunTest::StartFailure(std::move(testRun),
                                 "Failed to change working directory to " +
                                   this->Properties[test]->Directory + " : " +
                                   std::strerror(workdir.GetLastResult()),
                                 "Failed to change working directory");
    return false;
  }

  // Ownership of 'testRun' has moved to another structure.
  // When the test finishes, FinishTestProcess will be called.
  return cmCTestRunTest::StartTest(std::move(testRun), this->Completed,
                                   this->Total);
}